

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O0

RTMatrix4x4 * __thiscall
RTMatrix4x4::operator*(RTMatrix4x4 *__return_storage_ptr__,RTMatrix4x4 *this,RTMatrix4x4 *mat)

{
  int local_20;
  int local_1c;
  int col;
  int row;
  RTMatrix4x4 *mat_local;
  RTMatrix4x4 *this_local;
  
  RTMatrix4x4(__return_storage_ptr__);
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      __return_storage_ptr__->m_data[local_1c][local_20] =
           this->m_data[local_1c][3] * mat->m_data[3][local_20] +
           this->m_data[local_1c][2] * mat->m_data[2][local_20] +
           this->m_data[local_1c][0] * mat->m_data[0][local_20] +
           this->m_data[local_1c][1] * mat->m_data[1][local_20];
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const RTMatrix4x4 RTMatrix4x4::operator *(const RTMatrix4x4& mat) const
{
    RTMatrix4x4 res;

    for (int row = 0; row < 4; row++)
        for (int col = 0; col < 4; col++)
            res.m_data[row][col] =
                    m_data[row][0] * mat.m_data[0][col] +
                    m_data[row][1] * mat.m_data[1][col] +
                    m_data[row][2] * mat.m_data[2][col] +
                    m_data[row][3] * mat.m_data[3][col];

    return res;
}